

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

void Sfm_LibCellProfile(Mio_Cell2_t *pCellBot,Mio_Cell2_t *pCellTop,int InTop,int nFanins,int *Perm,
                       int *pProf)

{
  int local_40;
  int local_34;
  int DelayAdd;
  int i;
  int *pProf_local;
  int *Perm_local;
  int nFanins_local;
  int InTop_local;
  Mio_Cell2_t *pCellTop_local;
  Mio_Cell2_t *pCellBot_local;
  
  if (pCellTop == (Mio_Cell2_t *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = (int)pCellTop->Delays[InTop];
  }
  for (local_34 = 0; local_34 < nFanins; local_34 = local_34 + 1) {
    if (Perm[local_34] < (int)(*(uint *)&pCellBot->field_0x10 >> 0x1c)) {
      pProf[local_34] = (int)pCellBot->Delays[Perm[local_34]] + local_40;
    }
    else if (Perm[local_34] < (int)((*(uint *)&pCellBot->field_0x10 >> 0x1c) + InTop)) {
      pProf[local_34] =
           (int)pCellTop->Delays[(int)(Perm[local_34] - (*(uint *)&pCellBot->field_0x10 >> 0x1c))];
    }
    else {
      pProf[local_34] =
           (int)pCellTop->Delays
                [(int)((Perm[local_34] - (*(uint *)&pCellBot->field_0x10 >> 0x1c)) + 1)];
    }
  }
  return;
}

Assistant:

void Sfm_LibCellProfile( Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop, int nFanins, int * Perm, int * pProf )
{
    int i, DelayAdd = (int)(pCellTop ? pCellTop->Delays[InTop] : 0);
    for ( i = 0; i < nFanins; i++ )
        if ( Perm[i] < (int)pCellBot->nFanins )
            pProf[i] = (int)pCellBot->Delays[Perm[i]] + DelayAdd;
        else if ( Perm[i] < (int)pCellBot->nFanins + InTop )
            pProf[i] = (int)pCellTop->Delays[Perm[i] - (int)pCellBot->nFanins];
        else // if ( Perm[i] >= (int)pCellBot->nFanins + InTop )
            pProf[i] = (int)pCellTop->Delays[Perm[i] - (int)pCellBot->nFanins + 1];
}